

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O0

int Llb_MtrFindBestColumn(Llb_Mtr_t *p,int iGrpStart)

{
  int local_4c;
  int local_48;
  int Counter;
  int iVar;
  int c;
  int k;
  int iGrpBest;
  int iGrp;
  int WeightBest;
  int WeightCur;
  int Cost2Best;
  int CostBest;
  int Cost2;
  int Cost;
  int iGrpStart_local;
  Llb_Mtr_t *p_local;
  
  WeightCur = 1000000000;
  WeightBest = 1000000000;
  iGrpBest = -1000000000;
  k = -1;
  c = -1;
  local_48 = 0;
  do {
    if (p->nRows - p->nFfs <= local_48) {
      k = iGrpStart;
      if (c < 0) {
        for (; k < p->nCols + -1; k = k + 1) {
          Cost2Best = 0;
          CostBest = 0;
          for (iVar = 0; iVar < p->nRows; iVar = iVar + 1) {
            if ((p->pProdVars[iVar] == '\0') && (p->pMatrix[k][iVar] == '\x01')) {
              CostBest = CostBest + 1;
              Cost2Best = p->pProdNums[iVar] + Cost2Best;
            }
          }
          if ((CostBest < WeightCur) || ((WeightCur == CostBest && (WeightBest < Cost2Best)))) {
            WeightCur = CostBest;
            WeightBest = Cost2Best;
            c = k;
          }
        }
        p_local._4_4_ = c;
      }
      else {
        p_local._4_4_ = c;
      }
      return p_local._4_4_;
    }
    if (((1 < p->pRowSums[local_48]) && (p->pProdVars[local_48] == '\x01')) &&
       (p->pProdNums[local_48] == 1)) {
      local_4c = 0;
      for (Counter = iGrpStart; Counter < p->nCols + -1; Counter = Counter + 1) {
        if (p->pMatrix[Counter][local_48] == '\x01') {
          k = Counter;
          local_4c = local_4c + 1;
        }
      }
      if (local_4c != 1) {
        __assert_fail("Counter == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                      ,0x65,"int Llb_MtrFindBestColumn(Llb_Mtr_t *, int)");
      }
      iGrp = 0;
      for (iVar = 0; iVar < p->nRows; iVar = iVar + 1) {
        if (((p->pProdVars[iVar] == '\x01') && (p->pMatrix[k][iVar] == '\x01')) &&
           (p->pProdNums[iVar] == 1)) {
          iGrp = iGrp + 2;
        }
        if ((p->pProdVars[iVar] == '\0') && (p->pMatrix[k][iVar] == '\x01')) {
          iGrp = iGrp + -1;
        }
      }
      if ((0 < iGrp) && (iGrpBest < iGrp)) {
        iGrpBest = iGrp;
        c = k;
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

int Llb_MtrFindBestColumn( Llb_Mtr_t * p, int iGrpStart )
{
    int Cost, Cost2, CostBest = ABC_INFINITY, Cost2Best = ABC_INFINITY;
    int WeightCur, WeightBest = -ABC_INFINITY, iGrp = -1, iGrpBest = -1;
    int k, c, iVar, Counter;
    // find partition that reduces partial product as much as possible
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    { 
        if ( p->pRowSums[iVar] < 2 )
            continue;
        // look at present variables that can be quantified
        if ( !(p->pProdVars[iVar] == 1 && p->pProdNums[iVar] == 1) )
            continue;
        // check that it appears in one partition only
        Counter = 0;
        for ( c = iGrpStart; c < p->nCols-1; c++ )
            if ( p->pMatrix[c][iVar] == 1 )
            {
                iGrp = c;
                Counter++;
            }
        assert( Counter == 1 );
        if ( Counter != 1 )
            Abc_Print( -1, "Llb_MtrFindBestColumn() Internal error!\n" );
        // find weight of this column
        WeightCur = 0;
        for ( k = 0; k < p->nRows; k++ )
        {
            // increase weight if variable k will be quantified from partial product
            if ( p->pProdVars[k] == 1 && p->pMatrix[iGrp][k] == 1 && p->pProdNums[k] == 1 ) 
                WeightCur += 2;
            // decrease weight if variable k will be added to partial product
            if ( p->pProdVars[k] == 0 && p->pMatrix[iGrp][k] == 1 )
                WeightCur--;
        }
        if ( WeightCur > 0 && WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            iGrpBest   = iGrp;
        }
    }
    if ( iGrpBest >= 0 )
        return iGrpBest;
    // could not find the group with any vars to quantify
    // select the group that contains as few extra variables as possible
    // if there is a tie, select variables that appear in less groups than others
    for ( iGrp = iGrpStart; iGrp < p->nCols-1; iGrp++ )
    {
        Cost = Cost2 = 0;
        for ( k = 0; k < p->nRows; k++ )
            if ( p->pProdVars[k] == 0 && p->pMatrix[iGrp][k] == 1 )
            {
                Cost++;
                Cost2 += p->pProdNums[k];
            }
        if ( CostBest >  Cost || 
            (CostBest == Cost && Cost2 > Cost2Best) )
        {
            CostBest  = Cost;
            Cost2Best = Cost2;
            iGrpBest  = iGrp;
        }
    }
    return iGrpBest;
}